

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O2

void __thiscall libtorrent::create_torrent::create_torrent(create_torrent *this,torrent_info *ti)

{
  info_hash_t *this_00;
  byte bVar1;
  pointer ppVar2;
  pointer paVar3;
  pointer pwVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  time_t tVar12;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar13;
  vector<char,std::allocator<char>> *pvVar14;
  announce_entry *t;
  pointer paVar15;
  pointer pwVar16;
  long lVar17;
  diff_type piece;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> i;
  piece_index_t index;
  file_index_t index_00;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar18;
  ulong uVar19;
  pointer ppVar20;
  string_view url;
  string_view url_00;
  span<const_char> sVar21;
  undefined1 local_78 [8];
  pointer pcStack_70;
  pointer local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_58;
  
  anon_unknown_40::convert_file_storage
            ((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
              *)local_78,&ti->m_files);
  (this->m_files).
  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_78;
  (this->m_files).
  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = pcStack_70;
  (this->m_files).
  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
  local_78 = (undefined1  [8])0x0;
  pcStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  ::std::vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>::
  ~vector((vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_> *)
          local_78);
  this->m_total_size = (ti->m_files).m_total_size;
  iVar11 = (ti->m_files).m_num_pieces;
  this->m_piece_length = (ti->m_files).m_piece_length;
  this->m_num_pieces = iVar11;
  ::std::__cxx11::string::string((string *)&this->m_name,(string *)&(ti->m_files).m_name);
  entry::entry(&this->m_info_dict);
  (this->m_file_storage_compat).super__Optional_base<libtorrent::file_storage,_false,_false>.
  _M_payload.super__Optional_payload<libtorrent::file_storage,_true,_false,_false>.
  super__Optional_payload_base<libtorrent::file_storage>._M_engaged = false;
  (this->m_urls).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_urls).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_urls).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_url_seeds).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_url_seeds).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_url_seeds).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_piece_hash).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_piece_hash).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_piece_hash).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_filehashes).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filehashes).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filehashes).
  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_file_piece_hash).
  super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  .
  super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_file_piece_hash).
  super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  .
  super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_file_piece_hash).
  super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  .
  super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_similar).
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_similar).
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_similar).
  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_collections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_collections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_collections).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tVar12 = time((time_t *)0x0);
  this->m_creation_date = tVar12;
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  (this->m_root_cert)._M_dataplus._M_p = (pointer)&(this->m_root_cert).field_2;
  (this->m_root_cert)._M_string_length = 0;
  (this->m_root_cert).field_2._M_local_buf[0] = '\0';
  iVar11 = file_storage::num_files(&ti->m_files);
  bVar1 = this->field_0x258;
  this->field_0x258 = bVar1 & 0xfe | 1 < iVar11;
  this->field_0x258 = bVar1 & 0xf0 | 1 < iVar11 | (ti->m_flags).m_val & 2;
  this_00 = &ti->m_info_hash;
  bVar9 = info_hash_t::has_v1(this_00);
  this->field_0x258 = this->field_0x258 & 0xef | !bVar9 << 4;
  bVar9 = info_hash_t::has_v2(this_00);
  this->field_0x258 = this->field_0x258 & 0xdf | !bVar9 << 5;
  bVar9 = info_hash_t::has_v1(this_00);
  bVar10 = info_hash_t::has_v2(this_00);
  if (0 < (ti->m_files).m_piece_length) {
    if (0 < ti->m_creation_date) {
      this->m_creation_date = ti->m_creation_date;
    }
    if ((ti->m_created_by)._M_string_length != 0) {
      set_creator(this,(ti->m_created_by)._M_dataplus._M_p);
    }
    if ((ti->m_comment)._M_string_length != 0) {
      set_comment(this,(ti->m_comment)._M_dataplus._M_p);
    }
    ppVar2 = (ti->m_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar20 = (ti->m_nodes).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar20 != ppVar2;
        ppVar20 = ppVar20 + 1) {
      ::std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
      pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
            *)&local_58,ppVar20);
      ::std::
      vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
      ::emplace_back<std::pair<std::__cxx11::string,int>>
                ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                  *)&this->m_nodes,&local_58);
      ::std::__cxx11::string::~string((string *)&local_58);
    }
    paVar3 = (ti->m_urls).
             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             .
             super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (paVar15 = (ti->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   .
                   super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start; paVar15 != paVar3;
        paVar15 = paVar15 + 1) {
      url._M_str = (paVar15->url)._M_dataplus._M_p;
      url._M_len = (paVar15->url)._M_string_length;
      add_tracker(this,url,(uint)paVar15->tier);
    }
    pwVar4 = (ti->m_web_seeds).
             super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pwVar16 = (ti->m_web_seeds).
                   super__Vector_base<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start; pwVar16 != pwVar4;
        pwVar16 = pwVar16 + 1) {
      url_00._M_str = (pwVar16->url)._M_dataplus._M_p;
      url_00._M_len = (pwVar16->url)._M_string_length;
      add_url_seed(this,url_00);
    }
    if (bVar9) {
      aux::
      container_wrapper<libtorrent::digest32<160l>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
      ::resize<int,void>((container_wrapper<libtorrent::digest32<160l>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
                          *)&this->m_piece_hash,(ti->m_files).m_num_pieces);
      iVar13 = file_storage::piece_range(&ti->m_files);
      iVar18 = iVar13;
      while (index.m_val = (int)iVar18._begin.m_val, iVar13._end.m_val.m_val != index.m_val) {
        torrent_info::hash_for_piece((sha1_hash *)local_78,ti,index);
        set_hash(this,index,(sha1_hash *)local_78);
        iVar18._begin.m_val = index.m_val + 1;
        iVar18._end.m_val = 0;
      }
    }
    if (bVar10) {
      ::std::
      vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
      ::resize(&(this->m_file_piece_hash).
                super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
               ,((long)(this->m_files).
                       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       .
                       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x58);
      pcVar5 = (this->m_files).
               super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               .
               super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar6 = (this->m_files).
               super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               .
               super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (uVar19 = 0; uVar19 != (((long)pcVar5 - (long)pcVar6) / 0x58 & 0xffffffffU);
          uVar19 = uVar19 + 1) {
        pcVar7 = (this->m_files).
                 super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 .
                 super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((((file_flags_t *)((long)(pcVar7 + uVar19) + 0x28))->m_val & 1) == 0) &&
           (lVar17 = *(int64_t *)((long)(pcVar7 + uVar19) + 0x20), lVar17 != 0)) {
          index_00.m_val = (int)uVar19;
          if (this->m_piece_length < lVar17) {
            sVar21 = torrent_info::piece_layer(ti,index_00);
            piece.m_val = 0;
            for (lVar17 = 0; lVar17 < (int)sVar21.m_len; lVar17 = lVar17 + 0x20) {
              digest32<256L>::digest32((digest32<256L> *)local_78,sVar21.m_ptr + lVar17);
              set_hash2(this,index_00,piece,(digest32<256L> *)local_78);
              piece.m_val = piece.m_val + 1;
            }
          }
          else {
            file_storage::root((digest32<256L> *)local_78,&ti->m_files,index_00);
            set_hash2(this,index_00,(diff_type)0x0,(digest32<256L> *)local_78);
          }
        }
      }
    }
    pcVar8 = (ti->m_info_section).px;
    iVar11 = ti->m_info_section_size;
    pvVar14 = (vector<char,std::allocator<char>> *)entry::preformatted(&this->m_info_dict);
    ::std::vector<char,std::allocator<char>>::_M_assign_aux<char_const*>
              (pvVar14,pcVar8,pcVar8 + iVar11);
  }
  return;
}

Assistant:

create_torrent::create_torrent(torrent_info const& ti)
		: m_files(convert_file_storage(ti.files()))
		, m_total_size(ti.total_size())
		, m_piece_length(ti.piece_length())
		, m_num_pieces(ti.num_pieces())
		, m_name(ti.name())
		, m_creation_date(::time(nullptr))
		, m_multifile(ti.num_files() > 1)
		, m_private(ti.priv())
		, m_include_mtime(false)
		, m_include_symlinks(false)
		, m_v2_only(!ti.info_hashes().has_v1())
		, m_v1_only(!ti.info_hashes().has_v2())
	{
		bool const make_v1 = ti.info_hashes().has_v1();
		bool const make_v2 = ti.info_hashes().has_v2();

		TORRENT_ASSERT_PRECOND(make_v2 || make_v1);
		TORRENT_ASSERT_PRECOND(ti.is_valid());
		TORRENT_ASSERT_PRECOND(ti.num_pieces() > 0);
		TORRENT_ASSERT_PRECOND(ti.num_files() > 0);
		TORRENT_ASSERT_PRECOND(ti.total_size() > 0);

		if (!ti.is_valid()) return;
		if (ti.creation_date() > 0) m_creation_date = ti.creation_date();

		if (!ti.creator().empty()) set_creator(ti.creator().c_str());
		if (!ti.comment().empty()) set_comment(ti.comment().c_str());

		for (auto const& n : ti.nodes())
			add_node(n);

		for (auto const& t : ti.trackers())
			add_tracker(t.url, t.tier);

		for (auto const& s : ti.web_seeds())
			add_url_seed(s.url);

		if (make_v1)
		{
			m_piece_hash.resize(ti.num_pieces());
			for (auto const i : ti.piece_range())
				set_hash(i, ti.hash_for_piece(i));
		}

		if (make_v2)
		{
			m_file_piece_hash.resize(m_files.size());
			for (auto const i : file_range())
			{
				// don't include merkle hash trees for pad files
				if (m_files[i].flags & file_storage::flag_pad_file) continue;
				if (m_files[i].size == 0) continue;

				auto const file_size = m_files[i].size;
				if (file_size <= m_piece_length)
				{
					set_hash2(i, piece_index_t::diff_type{0}, ti.files().root(i));
					continue;
				}

				span<char const> pieces = ti.piece_layer(i);

				piece_index_t::diff_type p{0};
				for (int h = 0; h < int(pieces.size()); h += int(sha256_hash::size()))
					set_hash2(i, p++, sha256_hash(pieces.data() + h));
			}
		}

		auto const info = ti.info_section();
		m_info_dict.preformatted().assign(info.data(), info.data() + info.size());
	}